

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O2

void __thiscall
tinyusdz::usdc::USDCReader::set_reader_config(USDCReader *this,USDCReaderConfig *config)

{
  Impl::set_reader_config(this->impl_,config);
  return;
}

Assistant:

void USDCReader::set_reader_config(const USDCReaderConfig &config) {
  impl_->set_reader_config(config);
}